

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA256_CTX context;
  SHA256_CTX SStack_88;
  
  sha256_Init(&SStack_88);
  sha256_Update(&SStack_88,data,len);
  sha256_Final(&SStack_88,digest);
  return;
}

Assistant:

void sha256_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA256_DIGEST_LENGTH]) {
    trezor::SHA256_CTX	context;
	sha256_Init(&context);
	sha256_Update(&context, data, len);
	sha256_Final(&context, digest);
}